

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O2

void __thiscall csv::CSVReader::iterator::iterator(iterator *this,CSVReader *_daddy,CSVRow *_row)

{
  this->daddy = _daddy;
  (this->row).data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->row).data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->row).data_start = 0;
  (this->row).fields_start = 0;
  (this->row).row_length = 0;
  this->i = 0;
  CSVRow::operator=(&this->row,_row);
  return;
}

Assistant:

CSV_INLINE CSVReader::iterator::iterator(CSVReader* _daddy, CSVRow&& _row) :
        daddy(_daddy) {
        row = std::move(_row);
    }